

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec75.c
# Opt level: O1

int If_CutPerformCheck75(If_Man_t *p,uint *pTruth0,int nVars,int nLeaves,char *pStr)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined8 uVar5;
  uint uVar6;
  If_Man_t *p_00;
  int iVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  byte bVar11;
  undefined1 *puVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  uint *pLimitU;
  undefined1 *puVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  undefined1 *puVar20;
  bool bVar21;
  bool bVar22;
  word *tLimit;
  word pTruth [4];
  char pDsdStr [1000];
  undefined4 in_stack_fffffffffffffb98;
  undefined1 local_458 [8];
  undefined8 local_450;
  undefined8 local_448;
  undefined8 local_440;
  char *local_438;
  If_Man_t *local_430;
  int local_424;
  ulong local_420;
  char local_418 [1000];
  
  local_458 = *(undefined1 (*) [8])pTruth0;
  local_450 = *(undefined8 *)(pTruth0 + 2);
  local_448 = *(undefined8 *)(pTruth0 + 4);
  local_440 = *(undefined8 *)(pTruth0 + 6);
  if (8 < nLeaves) {
    __assert_fail("nLeaves <= 8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec75.c"
                  ,0x133,"int If_CutPerformCheck75(If_Man_t *, unsigned int *, int, int, char *)");
  }
  local_430 = p;
  iVar8 = nLeaves;
  if (p->pPars->fCutMin == 0) {
    local_438 = pStr;
    if (nLeaves < 1) {
      iVar8 = 0;
      uVar9 = 0;
    }
    else {
      iVar7 = nLeaves + -6;
      uVar14 = 1 << ((byte)iVar7 & 0x1f);
      uVar6 = uVar14;
      if ((int)uVar14 < 2) {
        uVar6 = 1;
      }
      uVar13 = 0;
      uVar9 = 0;
      iVar8 = 0;
      do {
        bVar11 = (byte)uVar13;
        if (nLeaves < 7) {
          bVar21 = (s_Truths6Neg[uVar13] &
                   ((ulong)local_458 >> ((byte)(1 << (bVar11 & 0x1f)) & 0x3f) ^ (ulong)local_458))
                   == 0;
        }
        else {
          bVar21 = true;
          if (uVar13 < 6) {
            if (iVar7 != 0x1f) {
              lVar18 = 0;
              do {
                bVar21 = ((*(ulong *)(local_458 + lVar18 * 8) >>
                           ((byte)(1 << (bVar11 & 0x1f)) & 0x3f) ^
                          *(ulong *)(local_458 + lVar18 * 8)) & s_Truths6Neg[uVar13]) == 0;
                if (!bVar21) break;
                bVar22 = (ulong)uVar6 - 1 != lVar18;
                lVar18 = lVar18 + 1;
              } while (bVar22);
            }
          }
          else if (iVar7 != 0x1f) {
            uVar17 = (ulong)(uint)(1 << (bVar11 - 6 & 0x1f));
            puVar16 = local_458 + uVar17 * 8;
            lVar18 = (ulong)(uint)(2 << (bVar11 - 6 & 0x1f)) * 8;
            puVar12 = local_458;
            do {
              uVar10 = 0;
              do {
                if (*(long *)(puVar12 + uVar10 * 8) != *(long *)(puVar16 + uVar10 * 8)) {
                  bVar21 = false;
                  goto LAB_0041b787;
                }
                uVar10 = uVar10 + 1;
              } while (uVar17 != uVar10);
              puVar12 = puVar12 + lVar18;
              puVar16 = puVar16 + lVar18;
            } while (puVar12 < local_458 + (long)(int)uVar14 * 8);
          }
        }
LAB_0041b787:
        uVar15 = 1 << (bVar11 & 0x1f);
        iVar8 = iVar8 + (uint)(bVar21 ^ 1);
        if (bVar21 != false) {
          uVar15 = 0;
        }
        uVar9 = uVar9 | uVar15;
        uVar13 = uVar13 + 1;
      } while (uVar13 != (uint)nLeaves);
    }
    pStr = local_438;
    if (uVar9 != 0) {
      if ((int)uVar9 < 1) {
        __assert_fail("Supp > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                      ,0x575,"int Abc_TtSuppIsMinBase(int)");
      }
      pStr = pStr;
      if ((uVar9 + 1 & uVar9) != 0) {
        local_424 = iVar8;
        if (nLeaves < 1) {
          iVar7 = 0;
        }
        else {
          uVar6 = 1 << ((char)nLeaves - 6U & 0x1f);
          if (nLeaves < 7) {
            uVar6 = 1;
          }
          local_420 = (ulong)(uint)nLeaves;
          uVar13 = 0;
          iVar7 = 0;
          do {
            if ((uVar9 >> ((uint)uVar13 & 0x1f) & 1) != 0) {
              if (iVar7 < (int)(uint)uVar13) {
                uVar17 = uVar13;
                do {
                  uVar10 = uVar17 - 1;
                  if ((long)uVar17 < 6) {
                    if (0 < (int)uVar6) {
                      uVar17 = s_PMasks[uVar10][0];
                      uVar2 = s_PMasks[uVar10][1];
                      uVar3 = s_PMasks[uVar10][2];
                      uVar19 = 0;
                      do {
                        uVar4 = *(ulong *)(local_458 + uVar19 * 8);
                        bVar11 = (byte)(1 << ((byte)uVar10 & 0x1f));
                        *(ulong *)(local_458 + uVar19 * 8) =
                             (uVar4 & uVar3) >> (bVar11 & 0x3f) |
                             (uVar4 & uVar2) << (bVar11 & 0x3f) | uVar4 & uVar17;
                        uVar19 = uVar19 + 1;
                      } while (uVar6 != uVar19);
                    }
                  }
                  else if (uVar10 == 5) {
                    if (0 < (int)uVar6) {
                      puVar12 = local_458;
                      do {
                        puVar1 = (ulong *)(puVar12 + 4);
                        *puVar1 = *puVar1 << 0x20 | *puVar1 >> 0x20;
                        puVar12 = puVar12 + 0x10;
                      } while (puVar12 < local_458 + (long)(int)uVar6 * 8);
                    }
                  }
                  else if (0 < (int)uVar6) {
                    uVar14 = 1 << ((char)uVar17 - 7U & 0x1f);
                    if ((long)uVar17 < 8) {
                      uVar14 = 1;
                    }
                    puVar20 = local_458 + (ulong)(uVar14 * 2) * 8;
                    lVar18 = (long)(int)(uVar14 * 4) * 8;
                    puVar16 = local_458 + (ulong)uVar14 * 8;
                    puVar12 = local_458;
                    do {
                      if (0 < (int)uVar14) {
                        uVar17 = 0;
                        do {
                          uVar5 = *(undefined8 *)(puVar16 + uVar17 * 8);
                          *(undefined8 *)(puVar16 + uVar17 * 8) =
                               *(undefined8 *)(puVar20 + uVar17 * 8);
                          *(undefined8 *)(puVar20 + uVar17 * 8) = uVar5;
                          uVar17 = uVar17 + 1;
                        } while (uVar14 != uVar17);
                      }
                      puVar12 = puVar12 + (long)(int)(uVar14 * 4) * 8;
                      puVar20 = puVar20 + lVar18;
                      puVar16 = puVar16 + lVar18;
                    } while (puVar12 < local_458 + (long)(int)uVar6 * 8);
                  }
                  uVar17 = uVar10;
                } while ((long)iVar7 < (long)uVar10);
              }
              iVar7 = iVar7 + 1;
            }
            uVar13 = uVar13 + 1;
          } while (uVar13 != local_420);
        }
        pStr = local_438;
        iVar8 = local_424;
        if (iVar7 != local_424) {
          __assert_fail("Var == nVars",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                        ,0x6e7,"void Abc_TtShrink(word *, int, int, unsigned int)");
        }
      }
    }
  }
  uVar9 = 1;
  if ((5 < iVar8) &&
     ((7 < iVar8 ||
      (iVar7 = If_CutPerformCheck16(local_430,(uint *)local_458,nVars,iVar8,"44"), iVar7 == 0)))) {
    p_00 = local_430;
    if ((local_430->pPars->fDeriveLuts == 0) &&
       ((iVar8 == 8 && (local_430->pPars->fEnableCheck75 != 0)))) {
      uVar9 = 0;
      iVar8 = Dau_DsdDecompose((word *)local_458,8,0,0,local_418);
      if (iVar8 < 5) {
        uVar9 = Dau_DsdCheckDecAndExist((char *)CONCAT44(nVars,in_stack_fffffffffffffb98));
        uVar9 = uVar9 >> 4 & 1;
      }
    }
    else {
      iVar7 = If_CutPerformCheck45(local_430,(uint *)local_458,nVars,iVar8,pStr);
      if (iVar7 == 0) {
        iVar8 = If_CutPerformCheck54(p_00,(uint *)local_458,nVars,iVar8,pStr);
        uVar9 = (uint)(iVar8 != 0);
      }
    }
  }
  return uVar9;
}

Assistant:

int If_CutPerformCheck75( If_Man_t * p, unsigned * pTruth0, int nVars, int nLeaves, char * pStr )
{
    word * pTruthW = (word *)pTruth0;
    word pTruth[4] = { pTruthW[0], pTruthW[1], pTruthW[2], pTruthW[3] };
    assert( nLeaves <= 8 );
    if ( !p->pPars->fCutMin )
        Abc_TtMinimumBase( pTruth, NULL, nLeaves, &nLeaves );
    if ( nLeaves < 6 )
        return 1;
//    if ( nLeaves < 8 && If_CutPerformCheck07( p, (unsigned *)pTruth, nVars, nLeaves, "44" ) )
    if ( nLeaves < 8 && If_CutPerformCheck16( p, (unsigned *)pTruth, nVars, nLeaves, "44" ) )
        return 1;
    // this is faster but not compatible with -z
    if ( !p->pPars->fDeriveLuts && p->pPars->fEnableCheck75 && nLeaves == 8 )
    {
//        char pDsdStr[1000] = "(!(abd)!(c!([fe][gh])))";
        char pDsdStr[1000];
        int nSizeNonDec = Dau_DsdDecompose( (word *)pTruth, nLeaves, 0, 0, pDsdStr );
        if ( nSizeNonDec >= 5 )
            return 0;
        if ( Dau_DsdCheckDecAndExist(pDsdStr) & 0x10 ) // bit 4
            return 1;
        return 0;
    }
    if ( If_CutPerformCheck45( p, (unsigned *)pTruth, nVars, nLeaves, pStr ) )
        return 1;
    if ( If_CutPerformCheck54( p, (unsigned *)pTruth, nVars, nLeaves, pStr ) )
        return 1;
    return 0;
}